

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[20],int>
          (String *__return_storage_ptr__,kj *this,char (*params) [20],int *params_1)

{
  char (*value) [20];
  int *value_00;
  CappedArray<char,_14UL> local_48;
  ArrayPtr<const_char> local_30;
  char (*local_20) [20];
  int *params_local_1;
  char (*params_local) [20];
  
  local_20 = params;
  params_local_1 = (int *)this;
  params_local = (char (*) [20])__return_storage_ptr__;
  value = ::const((char (*) [20])this);
  local_30 = toCharSequence<char_const(&)[20]>(value);
  value_00 = fwd<int>((NoInfer<int> *)local_20);
  toCharSequence<int>(&local_48,value_00);
  _::concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>>
            (__return_storage_ptr__,(_ *)&local_30,(ArrayPtr<const_char> *)&local_48,
             (CappedArray<char,_14UL> *)params_1);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}